

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
tinyusdz::Prim::get_child_indices_from_primChildren
          (Prim *this,bool force_update,bool *indices_is_valid)

{
  vector<long,_std::allocator<long>_> *this_00;
  pointer pTVar1;
  long lVar2;
  pointer plVar3;
  pointer plVar4;
  undefined1 auVar5 [16];
  PrimMeta *pPVar6;
  pointer pPVar7;
  iterator iVar8;
  ulong uVar9;
  bool bVar10;
  long lVar11;
  undefined7 in_register_00000031;
  bool bVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> table;
  string tok;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  m;
  vector<long,_std::allocator<long>_> *local_c8;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_b0;
  key_type local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_60;
  
  if ((int)CONCAT71(in_register_00000031,force_update) == 0) {
    if (((long)(this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start >> 3 ==
         ((long)(this->_children).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->_children).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_start >> 4) * 0x21cfb2b78c13521d) &&
       (this->_child_dirty == false)) {
      if (indices_is_valid != (bool *)0x0) {
        *indices_is_valid = this->_primChildrenIndicesIsValid;
      }
      goto LAB_00135265;
    }
    this->_child_dirty = false;
  }
  pPVar6 = metas(this);
  if ((pPVar6->primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (pPVar6->primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<long,_std::allocator<long>_>::resize
              (&this->_primChildrenIndices,
               ((long)(this->_children).
                      super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->_children).
                      super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                      super__Vector_impl_data._M_start >> 4) * 0x21cfb2b78c13521d);
    auVar5 = _DAT_0023eff0;
    plVar3 = (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar4 = (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar3 != plVar4) {
      uVar9 = (long)plVar4 + (-8 - (long)plVar3);
      auVar16._8_4_ = (int)uVar9;
      auVar16._0_8_ = uVar9;
      auVar16._12_4_ = (int)(uVar9 >> 0x20);
      auVar14._0_8_ = uVar9 >> 3;
      auVar14._8_8_ = auVar16._8_8_ >> 3;
      uVar13 = 0;
      auVar14 = auVar14 ^ _DAT_0023eff0;
      auVar15 = _DAT_0023efe0;
      do {
        auVar16 = auVar15 ^ auVar5;
        if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                    auVar14._4_4_ < auVar16._4_4_) & 1)) {
          plVar3[uVar13] = uVar13;
        }
        if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
            auVar16._12_4_ <= auVar14._12_4_) {
          plVar3[uVar13 + 1] = uVar13 + 1;
        }
        uVar13 = uVar13 + 2;
        lVar11 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar11 + 2;
      } while (((uVar9 >> 3) + 2 & 0xfffffffffffffffe) != uVar13);
    }
    this->_primChildrenIndicesIsValid = true;
    if (indices_is_valid != (bool *)0x0) {
      *indices_is_valid = true;
    }
  }
  else {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b0._M_impl._0_8_ = 0;
    pPVar7 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
        _M_impl.super__Vector_impl_data._M_finish != pPVar7) {
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,unsigned_long&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                    *)&local_60,&pPVar7[local_b0._M_impl._0_8_]._elementPath._prim_part,
                   (unsigned_long *)&local_b0);
        local_b0._M_impl._0_8_ = local_b0._M_impl._0_8_ + 1;
        pPVar7 = (this->_children).
                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while ((ulong)local_b0._M_impl._0_8_ <
               (ulong)(((long)(this->_children).
                              super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pPVar7 >> 4) *
                      0x21cfb2b78c13521d));
    }
    local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_b0._M_impl.super__Rb_tree_header._M_header;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = &this->_primChildrenIndices;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
    pPVar6 = metas(this);
    std::vector<long,_std::allocator<long>_>::resize
              (this_00,(long)(pPVar6->primChildren).
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pPVar6->primChildren).
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5);
    if ((this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar9 = 0;
      bVar10 = true;
    }
    else {
      bVar10 = true;
      lVar11 = 8;
      uVar13 = 0;
      do {
        pPVar6 = metas(this);
        pTVar1 = (pPVar6->primChildren).
                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar2 = *(long *)((long)pTVar1 + lVar11 + -8);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,lVar2,
                   *(long *)((long)&(pTVar1->str_)._M_dataplus._M_p + lVar11) + lVar2);
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::find(&local_60,&local_80);
        if ((_Rb_tree_header *)iVar8._M_node == &local_60._M_impl.super__Rb_tree_header) {
          (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
          ._M_start[uVar13] = -1;
          bVar10 = false;
        }
        else {
          (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
          ._M_start[uVar13] = *(long *)(iVar8._M_node + 2);
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&local_b0,(unsigned_long *)(iVar8._M_node + 2));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        uVar13 = uVar13 + 1;
        uVar9 = (long)(this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar11 = lVar11 + 0x20;
      } while (uVar13 < uVar9);
    }
    bVar12 = false;
    if (local_b0._M_impl.super__Rb_tree_header._M_node_count == uVar9) {
      bVar12 = bVar10;
    }
    this->_primChildrenIndicesIsValid = bVar12;
    if (indices_is_valid != (bool *)0x0) {
      *indices_is_valid = bVar12;
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_erase(&local_b0,(_Link_type)local_b0._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
LAB_00135265:
  local_c8 = &this->_primChildrenIndices;
  return local_c8;
}

Assistant:

const std::vector<int64_t> &Prim::get_child_indices_from_primChildren(
    bool force_update, bool *indices_is_valid) const {
#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (!force_update && (_primChildrenIndices.size() == _children.size()) &&
      !_child_dirty) {
    // got cache.
    if (indices_is_valid) {
      (*indices_is_valid) = _primChildrenIndicesIsValid;
    }
    return _primChildrenIndices;
  }

  if (!force_update) {
    _child_dirty = false;
  }

  if (metas().primChildren.empty()) {
    _primChildrenIndices.resize(_children.size());
    std::iota(_primChildrenIndices.begin(), _primChildrenIndices.end(), 0);
    _primChildrenIndicesIsValid = true;
    if (indices_is_valid) {
      (*indices_is_valid) = _primChildrenIndicesIsValid;
    }
    return _primChildrenIndices;
  }

  std::map<std::string, size_t> m;  // name -> children() index map
  for (size_t i = 0; i < _children.size(); i++) {
    m.emplace(_children[i].element_name(), i);
  }
  std::set<size_t> table;  // to check uniqueness

  // Use the length of primChildren.
  _primChildrenIndices.resize(metas().primChildren.size());

  bool valid = true;

  for (size_t i = 0; i < _primChildrenIndices.size(); i++) {
    std::string tok = metas().primChildren[i].str();
    const auto it = m.find(tok);
    if (it != m.end()) {
      _primChildrenIndices[i] = int64_t(it->second);

      table.insert(it->second);
    } else {
      // Prim name not found.
      _primChildrenIndices[i] = -1;
      valid = false;
    }
  }

  if (table.size() != _primChildrenIndices.size()) {
    // duplicated index exists.
    valid = false;
  }

  _primChildrenIndicesIsValid = valid;
  if (indices_is_valid) {
    (*indices_is_valid) = _primChildrenIndicesIsValid;
  }

  return _primChildrenIndices;
}